

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_array.c
# Opt level: O0

void array_define_save(t_gobj *z,_binbuf *bb)

{
  t_symbol *ptVar1;
  _glist *local_30;
  _glist *gl;
  _glist *x;
  _binbuf *bb_local;
  t_gobj *z_local;
  
  if (z[3].g_pd == (t_pd)0x0) {
    local_30 = (_glist *)0x0;
  }
  else {
    local_30 = pd_checkglist((t_pd *)z[3].g_pd);
  }
  ptVar1 = gensym("obj");
  binbuf_addv(bb,"ssff",(double)(int)*(short *)&z[2].g_next,
              (double)(int)*(short *)((long)&z[2].g_next + 2),&s__X,ptVar1);
  binbuf_addbinbuf(bb,(_binbuf *)z[1].g_pd);
  binbuf_addsemi(bb);
  if (local_30 == (_glist *)0x0) {
    bug("array_define_save");
  }
  else {
    garray_savecontentsto((_garray *)local_30->gl_list,bb);
    obj_saveformat((t_object *)z,bb);
  }
  return;
}

Assistant:

void array_define_save(t_gobj *z, t_binbuf *bb)
{
    t_glist *x = (t_glist *)z;
    t_glist *gl = (x->gl_list ? pd_checkglist(&x->gl_list->g_pd) : 0);
    binbuf_addv(bb, "ssff", &s__X, gensym("obj"),
        (t_float)x->gl_obj.te_xpix, (t_float)x->gl_obj.te_ypix);
    binbuf_addbinbuf(bb, x->gl_obj.ob_binbuf);
    binbuf_addsemi(bb);

    if (gl)
    {
        garray_savecontentsto((t_garray *)gl->gl_list, bb);
        obj_saveformat(&x->gl_obj, bb);
    }
    else
        bug("array_define_save");
}